

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerBegin(Pager *pPager)

{
  int iVar1;
  Bitvec *pBVar2;
  int local_1c;
  int rc;
  Pager *pPager_local;
  
  iVar1 = pager_shared_lock(pPager);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (1 < pPager->iState) {
    return 0;
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-only database");
    return -0x4b;
  }
  local_1c = pager_wait_on_lock(pPager,2);
  if (local_1c == 0) {
    pBVar2 = unqliteBitvecCreate(pPager->pAllocator,pPager->dbSize);
    pPager->pVec = pBVar2;
    if (pPager->pVec == (Bitvec *)0x0) {
      unqliteGenOutofMem(pPager->pDb);
      local_1c = -1;
LAB_0010fdfc:
      pager_unlock_db(pPager,1);
      return local_1c;
    }
    pPager->iState = 2;
    pPager->dbOrigSize = pPager->dbSize;
    pPager->iJournalOfft = 0;
    pPager->nRec = 0;
    if (pPager->dbSize == 0) {
      local_1c = pager_create_header(pPager);
      if (local_1c != 0) goto LAB_0010fdfc;
      pPager->dbSize = 1;
      local_1c = 0;
    }
  }
  else if (local_1c == -0xe) {
    unqliteGenError(pPager->pDb,"Another process or thread have a reserved lock on this database");
  }
  return local_1c;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerBegin(Pager *pPager)
{
	int rc;
	/* Obtain a shared lock on the database first */
	rc = pager_shared_lock(pPager);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pPager->iState >= PAGER_WRITER_LOCKED ){
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		unqliteGenError(pPager->pDb,"Read-only database");
		/* Read only database */
		return UNQLITE_READ_ONLY;
	}
	/* Obtain a reserved lock on the database */
	rc = pager_wait_on_lock(pPager,RESERVED_LOCK);
	if( rc == UNQLITE_OK ){
		/* Create the bitvec */
		pPager->pVec = unqliteBitvecCreate(pPager->pAllocator,pPager->dbSize);
		if( pPager->pVec == 0 ){
			unqliteGenOutofMem(pPager->pDb);
			rc = UNQLITE_NOMEM;
			goto fail;
		}
		/* Change to the WRITER_LOCK state */
		pPager->iState = PAGER_WRITER_LOCKED;
		pPager->dbOrigSize = pPager->dbSize;
		pPager->iJournalOfft = 0;
		pPager->nRec = 0;
		if( pPager->dbSize < 1 ){
			/* Write the  database header */
			rc = pager_create_header(pPager);
			if( rc != UNQLITE_OK ){
				goto fail;
			}
			pPager->dbSize = 1;
		}
	}else if( rc == UNQLITE_BUSY ){
		unqliteGenError(pPager->pDb,"Another process or thread have a reserved lock on this database");
	}
	return rc;
fail:
	/* Downgrade to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
	return rc;
}